

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O1

Extra_UnateInfo_t * Extra_UnateInfoAllocate(int nVars)

{
  Extra_UnateInfo_t *pEVar1;
  Extra_UnateVar_t *__s;
  
  pEVar1 = (Extra_UnateInfo_t *)malloc(0x18);
  pEVar1->nVars = 0;
  pEVar1->nVarsMax = 0;
  *(undefined8 *)&pEVar1->nUnate = 0;
  pEVar1->pVars = (Extra_UnateVar_t *)0x0;
  pEVar1->nVars = nVars;
  __s = (Extra_UnateVar_t *)malloc((long)nVars << 2);
  pEVar1->pVars = __s;
  memset(__s,0,(long)nVars << 2);
  return pEVar1;
}

Assistant:

Extra_UnateInfo_t *  Extra_UnateInfoAllocate( int nVars )
{
    Extra_UnateInfo_t * p;
    // allocate and clean the storage for unateness info
    p = ABC_ALLOC( Extra_UnateInfo_t, 1 );
    memset( p, 0, sizeof(Extra_UnateInfo_t) );
    p->nVars     = nVars;
    p->pVars     = ABC_ALLOC( Extra_UnateVar_t, nVars );  
    memset( p->pVars, 0, nVars * sizeof(Extra_UnateVar_t) );
    return p;
}